

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-wrap.cpp
# Opt level: O0

CommandOptions * write_dolby_atmos_file(CommandOptions *Options)

{
  int iVar1;
  AESEncContext *this;
  HMACContext *this_00;
  CommandOptions *in_RSI;
  bool bVar2;
  Result_t local_550 [104];
  FrameBuffer local_4e8 [2];
  FrameBuffer local_480 [2];
  Result_t local_418 [108];
  uint local_3ac;
  string local_3a8 [4];
  ui32_t duration;
  Result_t local_340 [104];
  Result_t local_2d8 [104];
  Result_t local_270 [111];
  FortunaRNG local_201;
  undefined1 local_200 [7];
  FortunaRNG RNG;
  WriterInfo Info;
  DCDataDescriptor local_148 [2];
  undefined1 local_d9;
  undefined1 local_d8 [8];
  byte_t IV_buf [16];
  SequenceParser Parser;
  undefined1 local_b8 [8];
  AtmosDescriptor ADesc;
  undefined1 local_60 [8];
  FrameBuffer FrameBuffer;
  MXFWriter Writer;
  HMACContext *HMAC;
  AESEncContext *Context;
  CommandOptions *Options_local;
  Result_t *result;
  
  ASDCP::ATMOS::MXFWriter::MXFWriter((MXFWriter *)&FrameBuffer.field_0x20);
  ASDCP::DCData::FrameBuffer::FrameBuffer((FrameBuffer *)local_60,in_RSI->fb_size);
  ASDCP::ATMOS::AtmosDescriptor::AtmosDescriptor((AtmosDescriptor *)local_b8);
  ASDCP::DCData::SequenceParser::SequenceParser((SequenceParser *)(IV_buf + 8));
  local_d9 = 0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::front(&in_RSI->filenames);
  ASDCP::DCData::SequenceParser::OpenRead((string *)Options);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if (-1 < iVar1) {
    ASDCP::DCData::SequenceParser::FillDCDataDescriptor(local_148);
    Kumu::Result_t::~Result_t((Result_t *)local_148);
    Info._168_8_ = CommandOptions::PictureRate(in_RSI);
    ADesc.super_DCDataDescriptor.DataEssenceCoding._8_4_ = in_RSI->ffoa;
    ADesc.super_DCDataDescriptor.DataEssenceCoding._12_2_ =
         *(undefined2 *)&in_RSI->max_channel_count;
    ADesc.super_DCDataDescriptor.DataEssenceCoding._14_2_ = *(undefined2 *)&in_RSI->max_object_count
    ;
    local_b8 = (undefined1  [8])Info._168_8_;
    Kumu::GenRandomUUID((uchar *)&ADesc.FirstFrame);
    ADesc.AtmosID[8] = '\x01';
    if ((in_RSI->verbose_flag & 1U) != 0) {
      fprintf(_stderr,"Dolby ATMOS Data\n");
      fputs("AtmosDescriptor:\n",_stderr);
      fprintf(_stderr,"Frame Buffer size: %u\n",(ulong)in_RSI->fb_size);
      ASDCP::ATMOS::AtmosDescriptorDump((AtmosDescriptor *)local_b8,(_IO_FILE *)0x0);
    }
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if ((-1 < iVar1) && ((in_RSI->no_write_flag & 1U) == 0)) {
    ASDCP::WriterInfo::WriterInfo((WriterInfo *)local_200,&s_MyInfo.super_WriterInfo);
    if ((in_RSI->asset_id_flag & 1U) == 0) {
      Kumu::GenRandomUUID(Info.ProductUUID + 8);
    }
    else {
      Info.ProductUUID._8_8_ = *(undefined8 *)in_RSI->asset_id_value;
      Info.AssetUUID._0_8_ = *(undefined8 *)(in_RSI->asset_id_value + 8);
    }
    Info.ProductName.field_2._8_4_ = 2;
    if ((in_RSI->key_flag & 1U) != 0) {
      Kumu::FortunaRNG::FortunaRNG(&local_201);
      Kumu::GenRandomUUID(Info.AssetUUID + 8);
      Info.CryptographicKeyID[8] = '\x01';
      if ((in_RSI->key_id_flag & 1U) == 0) {
        create_random_uuid(Info.ContextID + 8);
      }
      else {
        Info.ContextID._8_8_ = *(undefined8 *)in_RSI->key_id_value;
        Info.CryptographicKeyID._0_8_ = *(undefined8 *)(in_RSI->key_id_value + 8);
      }
      this = (AESEncContext *)operator_new(8);
      ASDCP::AESEncContext::AESEncContext(this);
      ASDCP::AESEncContext::InitKey((uchar *)local_270);
      Kumu::Result_t::operator=((Result_t *)Options,local_270);
      Kumu::Result_t::~Result_t(local_270);
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar1) {
        Kumu::FortunaRNG::FillRandom((uchar *)&local_201,(uint)local_d8);
        ASDCP::AESEncContext::SetIVec((uchar *)local_2d8);
        Kumu::Result_t::operator=((Result_t *)Options,local_2d8);
        Kumu::Result_t::~Result_t(local_2d8);
      }
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if ((-1 < iVar1) && ((in_RSI->write_hmac & 1U) != 0)) {
        Info.CryptographicKeyID[9] = '\x01';
        this_00 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_00);
        ASDCP::HMACContext::InitKey((uchar *)local_340,(LabelSet_t)this_00);
        Kumu::Result_t::operator=((Result_t *)Options,local_340);
        Kumu::Result_t::~Result_t(local_340);
      }
      Kumu::FortunaRNG::~FortunaRNG(&local_201);
    }
    iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if (-1 < iVar1) {
      ASDCP::ATMOS::MXFWriter::OpenWrite
                (local_3a8,(WriterInfo *)&FrameBuffer.field_0x20,
                 (AtmosDescriptor *)&in_RSI->out_file,(uint)local_200);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_3a8);
      Kumu::Result_t::~Result_t((Result_t *)local_3a8);
    }
    ASDCP::WriterInfo::~WriterInfo((WriterInfo *)local_200);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if (-1 < iVar1) {
    local_3ac = 0;
    ASDCP::DCData::SequenceParser::Reset();
    Kumu::Result_t::operator=((Result_t *)Options,local_418);
    Kumu::Result_t::~Result_t(local_418);
    while( true ) {
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      bVar2 = false;
      if (-1 < iVar1) {
        bVar2 = local_3ac < in_RSI->duration;
        local_3ac = local_3ac + 1;
      }
      if (!bVar2) break;
      ASDCP::DCData::SequenceParser::ReadFrame(local_480);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_480);
      Kumu::Result_t::~Result_t((Result_t *)local_480);
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar1) {
        if ((in_RSI->verbose_flag & 1U) != 0) {
          ASDCP::DCData::FrameBuffer::Dump((_IO_FILE *)local_60,(uint)_stderr);
        }
        if ((in_RSI->encrypt_header_flag & 1U) != 0) {
          ASDCP::FrameBuffer::PlaintextOffset((FrameBuffer *)local_60,0);
        }
      }
      iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if ((-1 < iVar1) && ((in_RSI->no_write_flag & 1U) == 0)) {
        ASDCP::ATMOS::MXFWriter::WriteFrame
                  (local_4e8,(AESEncContext *)&FrameBuffer.field_0x20,(HMACContext *)local_60);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_4e8);
        Kumu::Result_t::~Result_t((Result_t *)local_4e8);
      }
    }
    bVar2 = Kumu::Result_t::operator==((Result_t *)Options,(Result_t *)Kumu::RESULT_ENDOFFILE);
    if (bVar2) {
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
    }
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if ((-1 < iVar1) && ((in_RSI->no_write_flag & 1U) == 0)) {
    ASDCP::ATMOS::MXFWriter::Finalize();
    Kumu::Result_t::operator=((Result_t *)Options,local_550);
    Kumu::Result_t::~Result_t(local_550);
  }
  local_d9 = 1;
  ASDCP::DCData::SequenceParser::~SequenceParser((SequenceParser *)(IV_buf + 8));
  ASDCP::DCData::FrameBuffer::~FrameBuffer((FrameBuffer *)local_60);
  ASDCP::ATMOS::MXFWriter::~MXFWriter((MXFWriter *)&FrameBuffer.field_0x20);
  return Options;
}

Assistant:

Result_t
write_dolby_atmos_file(CommandOptions& Options)
{
  AESEncContext*          Context = 0;
  HMACContext*            HMAC = 0;
  ATMOS::MXFWriter         Writer;
  DCData::FrameBuffer       FrameBuffer(Options.fb_size);
  ATMOS::AtmosDescriptor ADesc;
  DCData::SequenceParser    Parser;
  byte_t                  IV_buf[CBC_BLOCK_SIZE];

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
  {
    Parser.FillDCDataDescriptor(ADesc);
    ADesc.EditRate = Options.PictureRate();
    // TODO: fill AtmosDescriptor
    ADesc.FirstFrame = Options.ffoa;
    ADesc.MaxChannelCount = Options.max_channel_count;
    ADesc.MaxObjectCount = Options.max_object_count;
    Kumu::GenRandomUUID(ADesc.AtmosID);
    ADesc.AtmosVersion = 1;
    if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Dolby ATMOS Data\n");
	  fputs("AtmosDescriptor:\n", stderr);
      fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
      ATMOS::AtmosDescriptorDump(ADesc);
	}
  }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
  {
    WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
    if ( Options.asset_id_flag )
      memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
    else
      Kumu::GenRandomUUID(Info.AssetUUID);

    Info.LabelSetType = LS_MXF_SMPTE;

#ifdef HAVE_OPENSSL
      // configure encryption
    if( Options.key_flag )
	{
      Kumu::FortunaRNG        RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
      {
        Info.UsesHMAC = true;
        HMAC = new HMACContext;
        result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
      }
	}
#endif

    if ( ASDCP_SUCCESS(result) )
      result = Writer.OpenWrite(Options.out_file, Info, ADesc);
  }

  if ( ASDCP_SUCCESS(result) )
  {
    ui32_t duration = 0;
    result = Parser.Reset();

    while ( ASDCP_SUCCESS(result) && duration++ < Options.duration )
	{
      result = Parser.ReadFrame(FrameBuffer);

      if ( ASDCP_SUCCESS(result) )
      {
        if ( Options.verbose_flag )
          FrameBuffer.Dump(stderr, Options.fb_dump_size);

        if ( Options.encrypt_header_flag )
          FrameBuffer.PlaintextOffset(0);
      }

      if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
      {
        result = Writer.WriteFrame(FrameBuffer, Context, HMAC);

        // The Writer class will forward the last block of ciphertext
        // to the encryption context for use as the IV for the next
        // frame. If you want to use non-sequitur IV values, un-comment
        // the following  line of code.
        // if ( ASDCP_SUCCESS(result) && Options.key_flag )
        //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
      }
	}

    if ( result == RESULT_ENDOFFILE )
      result = RESULT_OK;
  }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}